

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

PropertyId Js::JavascriptProxy::EnsureHandlerPropertyId(ScriptContext *scriptContext)

{
  ThreadContext *this;
  char16_t *string;
  RecyclableData *pRVar1;
  Type *pTVar2;
  size_t sVar3;
  PropertyRecord *pPVar4;
  CharacterBuffer<char16_t> local_38;
  
  this = scriptContext->threadContext;
  if (this->handlerPropertyId == -1) {
    pRVar1 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    if ((pRVar1->autoProxyName).ptr == (char16_t *)0x0) {
      pTVar2 = (Type *)&DAT_015d6350;
    }
    else {
      pRVar1 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      pTVar2 = &pRVar1->autoProxyName;
    }
    string = pTVar2->ptr;
    sVar3 = PAL_wcslen(string);
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.string.ptr = string;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    local_38.len = (Type)sVar3;
    pPVar4 = ThreadContext::GetOrAddPropertyRecordBind(this,&local_38);
    this->handlerPropertyId = pPVar4->pid;
  }
  return this->handlerPropertyId;
}

Assistant:

PropertyId JavascriptProxy::EnsureHandlerPropertyId(ScriptContext* scriptContext)
    {
        ThreadContext* threadContext = scriptContext->GetThreadContext();
        if (threadContext->handlerPropertyId == Js::Constants::NoProperty)
        {
            LPCWSTR autoProxyName;

            if (threadContext->GetAutoProxyName() != nullptr)
            {
                autoProxyName = threadContext->GetAutoProxyName();
            }
            else
            {
                autoProxyName = Js::Configuration::Global.flags.autoProxy;
            }

            threadContext->handlerPropertyId = threadContext->GetOrAddPropertyRecordBind(
                JsUtil::CharacterBuffer<WCHAR>(autoProxyName, static_cast<charcount_t>(wcslen(autoProxyName))))->GetPropertyId();
        }
        return threadContext->handlerPropertyId;
    }